

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int mpt_init(int argc,char **argv)

{
  int iVar1;
  char cVar2;
  mpt_metatype *pmVar3;
  uint uVar4;
  mpt_config *cfg_00;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  mpt_logger *log;
  FILE *pFVar8;
  size_t sVar9;
  void *pvVar10;
  mpt_type_traits *pmVar11;
  mpt_metatype *pmVar12;
  mpt_node *node;
  char *pcVar13;
  char **ppcVar14;
  int iVar15;
  size_t len;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  char *local_d0;
  char *local_c0;
  int dbg;
  undefined4 uStack_b4;
  FILE *pFStack_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  char **local_90;
  mpt_config *cfg;
  mpt_node *local_80;
  uint8_t local_78 [4];
  ulong local_70;
  mpt_metatype *local_68;
  void *local_60;
  mpt_path p;
  
  p.len = 0;
  p.first = '\0';
  p.flags = '\0';
  p.sep = '.';
  p.assign = '\0';
  p._28_4_ = 0;
  p.base = (char *)0x0;
  p.off = 0;
  local_90 = argv;
  pcVar7 = getenv("MPT_DEBUG");
  if (pcVar7 != (char *)0x0) {
    dbg = 1;
    iVar5 = mpt_cint(&dbg,pcVar7,0,(int *)0x0);
    if (iVar5 < 0) {
      dbg = 1;
      iVar5 = 1;
    }
    else {
      iVar5 = dbg;
      if (0xe < dbg) {
        dbg = 0xf;
        iVar5 = 0xf;
      }
    }
    setDebug(iVar5);
  }
  mpt_path_set(&p,"mpt",-1);
  local_68 = mpt_config_global(&p);
  if (local_68 == (mpt_metatype *)0x0) {
    return -4;
  }
  (*(local_68->_vptr->convertable).convert)((mpt_convertable *)local_68,0x85,&cfg);
  cfg_00 = cfg;
  pcVar7 = getenv("MPT_PREFIX_ETC");
  log = mpt_log_default();
  mpt_config_load(cfg_00,pcVar7,log);
  pcVar7 = getenv("MPT_FLAGS");
  if (pcVar7 != (char *)0x0) {
    iVar15 = 0;
    iVar5 = 0;
    while( true ) {
      while( true ) {
        pcVar13 = pcVar7 + 1;
        cVar2 = *pcVar7;
        pcVar7 = pcVar13;
        if (cVar2 != 'E') break;
        if (iVar15 != 0) {
          mpt_log((mpt_logger *)0x0,"mpt_init",4,"%s");
        }
        setEnviron((char *)0x0);
      }
      if (cVar2 == '\0') break;
      if (cVar2 == 'e') {
        iVar1 = iVar15 + 1;
        bVar17 = iVar15 == 0;
        iVar15 = iVar1;
        if (bVar17) {
          setEnviron("mpt_*");
        }
      }
      else if (cVar2 == 'v') {
        setDebug(iVar5);
        iVar5 = iVar5 + 1;
      }
      else {
        mpt_log((mpt_logger *)0x0,"mpt_init",0x10,"%s, %c","unknown operation flag",
                (ulong)(uint)(int)cVar2);
      }
    }
  }
  local_d0 = (char *)0x0;
  mpt_config_set(cfg,(char *)0x0,*local_90,0,0);
  local_c0 = (char *)0x0;
  local_70 = 0;
  uVar18 = 0;
LAB_0011c40f:
  uVar6 = (uint)uVar18;
  if (argc <= (int)_optind) goto LAB_0011c756;
  iVar5 = __posix_getopt(argc,local_90,"+f:c:l:Ee:v");
  pcVar7 = _optarg;
  uVar4 = _optind;
  switch(iVar5) {
  case 99:
    if (local_c0 == (char *)0x0) {
      pcVar7 = "connect";
      local_c0 = _optarg;
LAB_0011c5cb:
      uVar6 = mpt_config_set(cfg,pcVar7,_optarg,0,0);
      uVar18 = (ulong)uVar6;
      if ((int)uVar6 < 0) goto LAB_0011c756;
      goto LAB_0011c40f;
    }
    break;
  case 100:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
    break;
  case 0x65:
    setEnviron(_optarg);
    uVar18 = 0x65;
    goto LAB_0011c40f;
  case 0x66:
    local_60 = (void *)0x0;
    local_a8 = 1;
    uStack_a0._0_2_ = 0xff;
    uStack_a0._2_2_ = 0xff;
    uStack_a0._4_2_ = 0;
    uStack_a0._6_1_ = '\0';
    uStack_a0._7_1_ = '\0';
    _dbg = (code *)0x0;
    pFStack_b0 = (FILE *)0x0;
    local_80 = (mpt_node *)0x2722003d007d7b;
    local_78[0] = '#';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    pmVar12 = mpt_config_global((mpt_path *)0x0);
    (*(pmVar12->_vptr->convertable).convert)((mpt_convertable *)pmVar12,0x85,&local_60);
    pFVar8 = fopen(pcVar7,"r");
    if (pFVar8 == (FILE *)0x0) {
      mpt_log((mpt_logger *)0x0,"mpt_init::config",3,"%s: %s","failed to open config file",pcVar7);
      goto LAB_0011c6df;
    }
    pFStack_b0 = fopen(pcVar7,"r");
    if (pFStack_b0 != (FILE *)0x0) goto code_r0x0011c4e7;
    uVar18 = 0;
    goto LAB_0011c40f;
  case 0x6c:
    if (local_d0 == (char *)0x0) {
      pcVar7 = "listen";
      local_d0 = _optarg;
      goto LAB_0011c5cb;
    }
    break;
  default:
    if (iVar5 == 0x45) {
      setEnviron((char *)0x0);
      uVar18 = 0x45;
    }
    else {
      if (iVar5 != 0x76) {
        uVar6 = 0xffffffff;
        if (iVar5 != -1) goto LAB_0011c756;
        lVar16 = (long)(int)_optind;
        _dbg = (code *)0x0;
        local_80 = (mpt_node *)0x0;
        (*(local_68->_vptr->convertable).convert)((mpt_convertable *)local_68,9,&local_80);
        if (local_80 != (mpt_node *)0x0) {
          ppcVar14 = local_90 + lVar16;
          iVar5 = argc - uVar4;
          goto LAB_0011c63d;
        }
        uVar6 = 0xfffffffd;
        goto LAB_0011c756;
      }
      iVar5 = (int)local_70;
      setDebug(iVar5);
      local_70 = (ulong)(iVar5 + 1);
      uVar18 = 0x76;
    }
    goto LAB_0011c40f;
  }
  uVar6 = 0xffffffff;
  goto LAB_0011c756;
code_r0x0011c4e7:
  mpt_parse_format((mpt_parser_format *)&local_80,(char *)0x0);
  _dbg = mpt_getchar_stdio;
  local_a8 = 1;
  uVar6 = mpt_parse_config(mpt_parse_format_pre,(mpt_parser_format *)&local_80,
                           (mpt_parser_context *)&dbg,saveGlobal,local_60);
  uVar18 = (ulong)uVar6;
  fclose(pFStack_b0);
  if ((int)uVar6 < 0) goto LAB_0011c6b0;
  goto LAB_0011c40f;
LAB_0011c6b0:
  mpt_log((mpt_logger *)0x0,"mpt_init::config",3,"%s %d (line %d): %s","parse error",uVar18,
          local_a8 & 0xffffffff,pcVar7);
LAB_0011c6df:
  uVar6 = 0xffffffff;
  goto LAB_0011c756;
  while( true ) {
    pcVar7 = *ppcVar14;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      len = 1;
    }
    else {
      sVar9 = strlen(pcVar7);
      len = sVar9 + 1;
    }
    pvVar10 = mpt_array_append((mpt_array *)&dbg,len,pcVar7);
    ppcVar14 = ppcVar14 + 1;
    iVar5 = iVar5 + -1;
    if (pvVar10 == (void *)0x0) break;
LAB_0011c63d:
    if (iVar5 < 1) {
      pmVar11 = mpt_type_traits(99);
      ((mpt_buffer *)_dbg)->_content_traits = pmVar11;
      pmVar12 = mpt_meta_buffer((mpt_array *)&dbg);
      mpt_array_clone((mpt_array *)&dbg,(mpt_array *)0x0);
      if (pmVar12 == (mpt_metatype *)0x0) goto LAB_0011c74b;
      uVar6 = 0xffffffff;
      node = mpt_node_find(local_80,"args",-1);
      if (node == (mpt_node *)0x0) {
        node = mpt_node_new(5);
        if (node == (mpt_node *)0x0) {
          (*pmVar12->_vptr->unref)(pmVar12);
          goto LAB_0011c756;
        }
        mpt_identifier_set(&node->ident,"args",-1);
        mpt_node_insert(local_80,1,node);
      }
      else {
        pmVar3 = node->_meta;
        if (pmVar3 != (mpt_metatype *)0x0) {
          (*pmVar3->_vptr->unref)(pmVar3);
        }
      }
      node->_meta = pmVar12;
      uVar6 = 0;
      goto LAB_0011c756;
    }
  }
  mpt_array_clone((mpt_array *)&dbg,(mpt_array *)0x0);
LAB_0011c74b:
  uVar6 = 0xfffffffc;
LAB_0011c756:
  (*local_68->_vptr->unref)(local_68);
  atexit(clearConfig);
  if (-1 < (int)uVar6) {
    uVar6 = _optind;
  }
  return uVar6;
}

Assistant:

extern int mpt_init(int argc, char * const argv[])
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	MPT_INTERFACE(metatype) *top;
	MPT_INTERFACE(config) *cfg;
	const char *ctl = 0, *src = 0, *debug, *flags;
	int lv = 0, ret;
	
	if ((debug = getenv("MPT_DEBUG"))) {
		int dbg = 1;
		if (mpt_cint(&dbg, debug, 0, 0) < 0) {
			dbg = 1;
		}
		else if (dbg > 0xe) {
			dbg = 0xf;
		}
		setDebug(dbg);
	}
	/* use global mpt config section */
	mpt_path_set(&p, "mpt", -1);
	if (!(top = mpt_config_global(&p))) {
		return MPT_ERROR(BadOperation);
	}
	MPT_metatype_convert(top, MPT_ENUM(TypeConfigPtr), &cfg);
	
	/* load configs in `etc` subdirectory */
	mpt_config_load(cfg, getenv("MPT_PREFIX_ETC"), mpt_log_default());
	
	/* additional flags from enfironment */
	if ((flags = getenv("MPT_FLAGS"))) {
		int env = 0;
		char curr;
		while ((curr = *flags++)) {
			switch (curr) {
			  case 'v':
				setDebug(lv++);
				continue;
			  case 'E':
				/* global environment loading (masks granular) */
				if (env) {
					mpt_log(0, __func__, MPT_LOG(Warning), "%s",
					        MPT_tr("global environment load after specialized"));
				}
				setEnviron(0);
				continue;
			  case 'e':
				/* limited environment on first occurance only */
				if (!env++) {
					setEnviron("mpt_*");
				}
				continue;
			  default:
				mpt_log(0, __func__, MPT_LOG(Debug), "%s, %c",
				        MPT_tr("unknown operation flag"), curr);
			}
		}
	}
	/* set executable name */
	mpt_config_set(cfg, 0, argv[0], 0, 0);
	
	ret = 0;
	lv = 0; /* reset debug level */
	while (optind < argc) {
		switch (ret = getopt(argc, argv, "+f:c:l:Ee:v")) {
		    case -1:
			ret = saveArgs(top, argc - optind, argv + optind);
			break;
		    case 'f':
			if ((ret = loadConfig(0, optarg)) < 0) {
				break;
			}
			continue;
		    case 'c':
			if (ctl) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			ctl = optarg;
			if ((ret = mpt_config_set(cfg, "connect", ctl, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'l':
			if (src) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			src = optarg;
			if ((ret = mpt_config_set(cfg, "listen", src, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'v':
			setDebug(lv++);
			continue;
		    case 'E':
			setEnviron(0);
			continue;
		    case 'e':
			setEnviron(optarg);
			continue;
		    default:
			ret = MPT_ERROR(BadArgument);
		}
		break;
	}
	top->_vptr->unref(top);
	atexit(clearConfig);
	
	return ret < 0 ? ret : optind;
}